

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Fixed * ft_var_readpackeddeltas(FT_Stream stream,FT_ULong size,FT_UInt delta_cnt)

{
  FT_Memory memory;
  byte bVar1;
  byte bVar2;
  FT_Byte FVar3;
  FT_UInt16 FVar4;
  int iVar5;
  uint uVar6;
  FT_Fixed *P;
  uint uVar7;
  ulong new_count;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  FT_Error error;
  ulong local_68;
  int local_34;
  
  memory = stream->memory;
  new_count = (ulong)delta_cnt;
  uVar8 = 0;
  P = (FT_Fixed *)ft_mem_qrealloc(memory,8,0,new_count,(void *)0x0,&local_34);
  if (local_34 == 0) {
    local_68 = 0;
    do {
      uVar10 = (uint)uVar8;
      if ((delta_cnt <= uVar10) || (size <= local_68)) {
        if (delta_cnt <= uVar10) {
          return P;
        }
        break;
      }
      bVar1 = FT_Stream_GetByte(stream);
      bVar2 = bVar1 & 0x3f;
      uVar7 = (uint)bVar2;
      iVar5 = (int)local_68;
      if ((char)bVar1 < '\0') {
        local_68 = (ulong)(iVar5 + 1);
        uVar9 = uVar8 & 0xffffffff;
        uVar8 = (ulong)(~uVar10 + delta_cnt);
        if ((ulong)bVar2 <= (ulong)(~uVar10 + delta_cnt)) {
          uVar8 = (ulong)bVar2;
        }
        uVar10 = 0;
        memset(P + uVar9,0,uVar8 * 8 + 8);
        uVar8 = new_count + (-1 - uVar9);
        if ((bVar1 & 0x3f) <= uVar8) {
          uVar8 = (ulong)(bVar1 & 0x3f);
        }
        uVar6 = (int)uVar8 + 1;
        uVar8 = uVar9 + uVar8 + 1;
        do {
          if (uVar7 <= uVar10) break;
          uVar9 = uVar9 + 1;
          uVar10 = uVar10 + 1;
        } while (uVar9 < new_count);
      }
      else if (bVar1 < 0x40) {
        local_68 = (ulong)(iVar5 + (uint)bVar2 + 2);
        if (size < local_68) break;
        uVar8 = uVar8 & 0xffffffff;
        uVar10 = 0;
        do {
          FVar3 = FT_Stream_GetByte(stream);
          P[uVar8] = (long)(char)FVar3 << 0x10;
          uVar8 = uVar8 + 1;
          uVar6 = uVar10 + 1;
          if (bVar2 <= uVar10) break;
          uVar10 = uVar6;
        } while (uVar8 < new_count);
      }
      else {
        local_68 = (ulong)(iVar5 + (uint)bVar2 * 2 + 3);
        if (size < local_68) break;
        uVar8 = uVar8 & 0xffffffff;
        uVar10 = 0;
        do {
          FVar4 = FT_Stream_GetUShort(stream);
          P[uVar8] = (long)(short)FVar4 << 0x10;
          uVar8 = uVar8 + 1;
          uVar6 = uVar10 + 1;
          if (uVar7 <= uVar10) break;
          uVar10 = uVar6;
        } while (uVar8 < new_count);
      }
    } while (uVar7 < uVar6);
    ft_mem_free(memory,P);
  }
  return (FT_Fixed *)0x0;
}

Assistant:

static FT_Fixed*
  ft_var_readpackeddeltas( FT_Stream  stream,
                           FT_ULong   size,
                           FT_UInt    delta_cnt )
  {
    FT_Fixed  *deltas = NULL;
    FT_UInt    runcnt, cnt;
    FT_UInt    i, j;
    FT_UInt    bytes_used;
    FT_Memory  memory = stream->memory;
    FT_Error   error;


    if ( FT_QNEW_ARRAY( deltas, delta_cnt ) )
      return NULL;

    i          = 0;
    bytes_used = 0;

    while ( i < delta_cnt && bytes_used < size )
    {
      runcnt = FT_GET_BYTE();
      cnt    = runcnt & GX_DT_DELTA_RUN_COUNT_MASK;

      bytes_used++;

      if ( runcnt & GX_DT_DELTAS_ARE_ZERO )
      {
        /* `cnt` + 1 zeroes get added */
        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = 0;
      }
      else if ( runcnt & GX_DT_DELTAS_ARE_WORDS )
      {
        /* `cnt` + 1 shorts from the stack */
        bytes_used += 2 * ( cnt + 1 );
        if ( bytes_used > size )
        {
          FT_TRACE1(( "ft_var_readpackeddeltas:"
                      " number of short deltas too large\n" ));
          goto Fail;
        }

        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = FT_intToFixed( FT_GET_SHORT() );
      }
      else
      {
        /* `cnt` + 1 signed bytes from the stack */
        bytes_used += cnt + 1;
        if ( bytes_used > size )
        {
          FT_TRACE1(( "ft_var_readpackeddeltas:"
                      " number of byte deltas too large\n" ));
          goto Fail;
        }

        for ( j = 0; j <= cnt && i < delta_cnt; j++ )
          deltas[i++] = FT_intToFixed( FT_GET_CHAR() );
      }

      if ( j <= cnt )
      {
        FT_TRACE1(( "ft_var_readpackeddeltas:"
                    " number of deltas too large\n" ));
        goto Fail;
      }
    }

    if ( i < delta_cnt )
    {
      FT_TRACE1(( "ft_var_readpackeddeltas: not enough deltas\n" ));
      goto Fail;
    }

    return deltas;

  Fail:
    FT_FREE( deltas );
    return NULL;
  }